

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupLayer(CEditor *this,void *pContext,CUIRect View)

{
  uint uVar1;
  long lVar2;
  CLayer *pCVar3;
  CLayerGroup *this_00;
  bool bVar4;
  int iVar5;
  CLayer *pCVar6;
  CLayer *pCVar7;
  long in_FS_OFFSET;
  int NewVal;
  CUIRect Button;
  CLayer *pCurrentLayer;
  CUIRect View_local;
  CProperty aProps [4];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  View_local = View;
  pCVar6 = GetSelectedLayer(this,0);
  pCVar3 = (CLayer *)(this->m_Map).m_pGameLayer;
  pCurrentLayer = pCVar6;
  CUIRect::HSplitBottom(&View_local,12.0,&View_local,&Button);
  pCVar7 = pCVar6;
  if (pCVar3 != pCVar6) {
    iVar5 = DoButton_Editor(this,&PopupLayer::s_DeleteButton,"Delete layer",0,&Button,0,
                            "Deletes the layer");
    if (iVar5 != 0) {
      CLayerGroup::DeleteLayer
                ((this->m_Map).m_lGroups.list[this->m_SelectedGroup],this->m_SelectedLayer);
      bVar4 = true;
      goto LAB_00199527;
    }
    CUIRect::HSplitBottom(&View_local,5.0,&View_local,&Button);
    CUIRect::HSplitBottom(&View_local,16.0,&View_local,&Button);
    CUI::DoLabel(&this->m_UI,&Button,"Name:",10.0,0,-1.0,true);
    CUIRect::VSplitLeft(&Button,40.0,(CUIRect *)0x0,&Button);
    if ((PopupLayer(void*,CUIRect)::s_NameInput == '\0') &&
       (iVar5 = __cxa_guard_acquire(&PopupLayer(void*,CUIRect)::s_NameInput), iVar5 != 0)) {
      CLineInput::CLineInput(&PopupLayer::s_NameInput);
      __cxa_atexit(CLineInput::~CLineInput,&PopupLayer::s_NameInput,&__dso_handle);
      __cxa_guard_release(&PopupLayer(void*,CUIRect)::s_NameInput);
    }
    pCVar7 = pCurrentLayer;
    CLineInput::SetBuffer(&PopupLayer::s_NameInput,pCurrentLayer->m_aName,0xc);
    bVar4 = DoEditBox(this,&PopupLayer::s_NameInput,&Button,10.0);
    if (bVar4) {
      (this->m_Map).m_Modified = true;
    }
  }
  CUIRect::HSplitBottom(&View_local,10.0,&View_local,(CUIRect *)0x0);
  aProps[0].m_Value = this->m_SelectedGroup;
  this_00 = (this->m_Map).m_lGroups.list[aProps[0].m_Value];
  aProps[0].m_pName = "Group";
  aProps[0].m_Type = 2;
  aProps[0].m_Min = 0;
  aProps[0].m_Max = (this->m_Map).m_lGroups.num_elements + -1;
  aProps[1].m_pName = "Order";
  aProps[1].m_Value = this->m_SelectedLayer;
  aProps[1].m_Type = 2;
  aProps[1].m_Min = 0;
  aProps[1].m_Max = (this_00->m_lLayers).num_elements;
  aProps[2].m_pName = "Detail";
  aProps[3].m_Min = 0;
  aProps[3].m_Max = 0;
  aProps[2].m_Value = pCVar7->m_Flags & 1;
  aProps[2].m_Max = 1;
  aProps[3].m_pName = (char *)0x0;
  aProps[3].m_Value = 0;
  aProps[3].m_Type = 0;
  if (pCVar3 == pCVar6) {
    aProps[0].m_Type = 0;
    aProps[0].m_Min = 0;
  }
  aProps[2]._13_7_ = 0;
  aProps[2].m_Type._0_1_ = pCVar3 != pCVar6;
  NewVal = 0;
  iVar5 = DoProperties(this,&View_local,aProps,PopupLayer::s_aIds,&NewVal);
  if (iVar5 != -1) {
    (this->m_Map).m_Modified = true;
    if (iVar5 == 0) {
      if (((pCVar3 != pCVar6) && (-1 < NewVal)) && (NewVal < (this->m_Map).m_lGroups.num_elements))
      {
        array<CLayer_*,_allocator_default<CLayer_*>_>::remove
                  (&this_00->m_lLayers,(char *)&pCurrentLayer);
        array<CLayer_*,_allocator_default<CLayer_*>_>::add
                  (&(this->m_Map).m_lGroups.list[NewVal]->m_lLayers,&pCurrentLayer);
        this->m_SelectedGroup = NewVal;
        this->m_SelectedLayer = ((this->m_Map).m_lGroups.list[NewVal]->m_lLayers).num_elements + -1;
        pCVar7 = pCurrentLayer;
      }
    }
    else if (iVar5 == 2) {
      uVar1 = pCVar7->m_Flags;
      pCVar7->m_Flags = uVar1 & 0xfffffffe;
      if (NewVal != 0) {
        pCVar7->m_Flags = uVar1 | 1;
      }
    }
    else if (iVar5 == 1) {
      iVar5 = CLayerGroup::SwapLayers(this_00,this->m_SelectedLayer,NewVal);
      this->m_SelectedLayer = iVar5;
    }
  }
  iVar5 = (*pCVar7->_vptr_CLayer[0xb])(pCVar7,&View_local);
  bVar4 = iVar5 != 0;
LAB_00199527:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CEditor::PopupLayer(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayer *pCurrentLayer = pEditor->GetSelectedLayer(0);
	bool IsGameLayer = pEditor->m_Map.m_pGameLayer == pCurrentLayer;

	// remove layer button
	CUIRect Button;
	View.HSplitBottom(12.0f, &View, &Button);
	static int s_DeleteButton = 0;

	// don't allow deletion of game layer
	if(!IsGameLayer && pEditor->DoButton_Editor(&s_DeleteButton, "Delete layer", 0, &Button, 0, "Deletes the layer"))
	{
		pEditor->m_Map.m_lGroups[pEditor->m_SelectedGroup]->DeleteLayer(pEditor->m_SelectedLayer);
		return true;
	}

	// layer name
	if(!IsGameLayer)
	{
		View.HSplitBottom(5.0f, &View, &Button);
		View.HSplitBottom(16.0f, &View, &Button);
		pEditor->UI()->DoLabel(&Button, "Name:", 10.0f, TEXTALIGN_LEFT);
		Button.VSplitLeft(40.0f, 0, &Button);
		static CLineInput s_NameInput;
		s_NameInput.SetBuffer(pCurrentLayer->m_aName, sizeof(pCurrentLayer->m_aName));
		if(pEditor->DoEditBox(&s_NameInput, &Button, 10.0f))
			pEditor->m_Map.m_Modified = true;
	}

	View.HSplitBottom(10.0f, &View, 0);

	CLayerGroup *pCurrentGroup = pEditor->m_Map.m_lGroups[pEditor->m_SelectedGroup];

	enum
	{
		PROP_GROUP=0,
		PROP_ORDER,
		PROP_HQ,
		NUM_PROPS,
	};

	CProperty aProps[] = {
		{"Group", pEditor->m_SelectedGroup, PROPTYPE_INT_STEP, 0, pEditor->m_Map.m_lGroups.size()-1},
		{"Order", pEditor->m_SelectedLayer, PROPTYPE_INT_STEP, 0, pCurrentGroup->m_lLayers.size()},
		{"Detail", pCurrentLayer->m_Flags&LAYERFLAG_DETAIL, PROPTYPE_BOOL, 0, 1},
		{0},
	};

	if(IsGameLayer) // dont use Group and Detail from the selection if this is the game layer
	{
		aProps[0].m_Type = PROPTYPE_NULL;
		aProps[2].m_Type = PROPTYPE_NULL;
	}

	static int s_aIds[NUM_PROPS] = {0};
	int NewVal = 0;
	int Prop = pEditor->DoProperties(&View, aProps, s_aIds, &NewVal);
	if(Prop != -1)
		pEditor->m_Map.m_Modified = true;

	if(Prop == PROP_ORDER)
		pEditor->m_SelectedLayer = pCurrentGroup->SwapLayers(pEditor->m_SelectedLayer, NewVal);
	else if(Prop == PROP_GROUP && !IsGameLayer)
	{
		if(NewVal >= 0 && NewVal < pEditor->m_Map.m_lGroups.size())
		{
			pCurrentGroup->m_lLayers.remove(pCurrentLayer);
			pEditor->m_Map.m_lGroups[NewVal]->m_lLayers.add(pCurrentLayer);
			pEditor->m_SelectedGroup = NewVal;
			pEditor->m_SelectedLayer = pEditor->m_Map.m_lGroups[NewVal]->m_lLayers.size()-1;
		}
	}
	else if(Prop == PROP_HQ)
	{
		pCurrentLayer->m_Flags &= ~LAYERFLAG_DETAIL;
		if(NewVal)
			pCurrentLayer->m_Flags |= LAYERFLAG_DETAIL;
	}

	return pCurrentLayer->RenderProperties(&View);
}